

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.cc
# Opt level: O0

BadStatusOrAccess * __thiscall
absl::lts_20250127::BadStatusOrAccess::operator=(BadStatusOrAccess *this,BadStatusOrAccess *other)

{
  BadStatusOrAccess *other_local;
  BadStatusOrAccess *this_local;
  
  InitWhat(other);
  Status::operator=(&this->status_,&other->status_);
  std::__cxx11::string::operator=((string *)&this->what_,(string *)&other->what_);
  return this;
}

Assistant:

BadStatusOrAccess& BadStatusOrAccess::operator=(
    const BadStatusOrAccess& other) {
  // Ensure assignment is correct regardless of whether this->InitWhat() has
  // already been called.
  other.InitWhat();
  status_ = other.status_;
  what_ = other.what_;
  return *this;
}